

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O1

void __thiscall
EncoderVelocity::SetData
          (EncoderVelocity *this,uint32_t rawPeriod,uint32_t rawQtr1,uint32_t rawQtr5,
          uint32_t rawRun,bool isESPM)

{
  byte bVar1;
  undefined7 in_register_00000089;
  double dVar2;
  
  this->velPeriodMax = 0;
  *(undefined4 *)((long)&this->velPeriodMax + 3) = 0;
  this->qtr1Period = 0;
  *(undefined4 *)((long)&this->qtr1Period + 3) = 0;
  this->qtr5Period = 0;
  *(undefined4 *)((long)&this->qtr5Period + 3) = 0;
  this->qtrPeriodMax = 0;
  this->runPeriod = 0;
  if ((int)CONCAT71(in_register_00000089,isESPM) == 0) {
    dVar2 = 2.0345052083333333e-08;
  }
  else {
    dVar2 = 1.25e-08;
  }
  this->clkPeriod = dVar2;
  this->velPeriodMax = 0x3ffffff;
  this->qtrPeriodMax = 0x3ffffff;
  this->velPeriod = rawPeriod & 0x3ffffff;
  bVar1 = (byte)(rawPeriod >> 0x18);
  this->velOverflow = (bool)(bVar1 >> 7);
  this->velDir = (bool)(bVar1 >> 6 & 1);
  this->dirChange = (bool)(bVar1 >> 5 & 1);
  this->encError = (bool)(bVar1 >> 4 & 1);
  this->partialCycle = (bool)(bVar1 >> 3 & 1);
  this->qtr1Period = rawQtr1 & 0x3ffffff;
  bVar1 = (byte)(rawQtr1 >> 0x18);
  this->qtr1Overflow = (bool)(bVar1 >> 7);
  this->qtr1Dir = (bool)(bVar1 >> 6 & 1);
  this->qtr1Edges = bVar1 >> 2 & 0xf;
  this->qtr5Period = rawQtr5 & 0x3ffffff;
  bVar1 = (byte)(rawQtr5 >> 0x18);
  this->qtr5Overflow = (bool)(bVar1 >> 7);
  this->qtr5Dir = (bool)(bVar1 >> 6 & 1);
  this->qtr5Edges = bVar1 >> 2 & 0xf;
  this->runPeriod = rawRun & 0x3ffffff;
  this->runOverflow = SUB41(rawRun >> 0x1f,0);
  return;
}

Assistant:

void EncoderVelocity::SetData(uint32_t rawPeriod, uint32_t rawQtr1, uint32_t rawQtr5, uint32_t rawRun,
                              bool isESPM)
{
    Init();
    clkPeriod = isESPM ? VEL_PERD_ESPM : VEL_PERD;
    velPeriodMax = ENC_VEL_MASK_26;
    qtrPeriodMax = ENC_VEL_QTR_MASK;  // 26 bits
    velPeriod = rawPeriod & ENC_VEL_MASK_26;
    velOverflow = rawPeriod & ENC_VEL_OVER_MASK;
    velDir = rawPeriod & ENC_DIR_MASK;
    dirChange = rawPeriod & 0x20000000;
    encError = rawPeriod & 0x10000000;
    partialCycle = rawPeriod & 0x08000000;
    qtr1Period = rawQtr1 & ENC_VEL_QTR_MASK;
    qtr1Overflow = rawQtr1 & ENC_VEL_OVER_MASK;
    qtr1Dir = rawQtr1 & ENC_DIR_MASK;
    qtr1Edges = (rawQtr1>>26)&0x0f;
    qtr5Period = rawQtr5 & ENC_VEL_QTR_MASK;
    qtr5Overflow = rawQtr5 & ENC_VEL_OVER_MASK;
    qtr5Dir = rawQtr5 & ENC_DIR_MASK;
    qtr5Edges = (rawQtr5>>26)&0x0f;
    runPeriod = rawRun & ENC_VEL_QTR_MASK;
    runOverflow = rawRun & ENC_VEL_OVER_MASK;
}